

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

string * __thiscall Json::Value::asString_abi_cxx11_(Value *this)

{
  char *pcVar1;
  runtime_error *this_00;
  byte *in_RSI;
  string *in_RDI;
  char *local_58;
  double in_stack_ffffffffffffffd8;
  allocator local_11 [17];
  
  switch(in_RSI[8]) {
  case 0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"",local_11);
    std::allocator<char>::~allocator((allocator<char> *)local_11);
    break;
  case 1:
    valueToString_abi_cxx11_((LargestInt)in_stack_ffffffffffffffd8);
    break;
  case 2:
    valueToString_abi_cxx11_((LargestUInt)in_stack_ffffffffffffffd8);
    break;
  case 3:
    valueToString_abi_cxx11_(in_stack_ffffffffffffffd8);
    break;
  case 4:
    if (*(long *)in_RSI == 0) {
      local_58 = "";
    }
    else {
      local_58 = *(char **)in_RSI;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,local_58,(allocator *)&stack0xffffffffffffffdb);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffdb);
    break;
  case 5:
    pcVar1 = "false";
    if ((*in_RSI & 1) != 0) {
      pcVar1 = "true";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,pcVar1,(allocator *)&stack0xffffffffffffffda);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffda);
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Type is not convertible to string");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return in_RDI;
}

Assistant:

std::string Value::asString() const {
  switch (type_) {
  case nullValue:
    return "";
  case stringValue:
    return value_.string_ ? value_.string_ : "";
  case booleanValue:
    return value_.bool_ ? "true" : "false";
  case intValue:
    return valueToString(value_.int_);
  case uintValue:
    return valueToString(value_.uint_);
  case realValue:
    return valueToString(value_.real_);
  default:
    JSON_FAIL_MESSAGE("Type is not convertible to string");
  }
}